

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void uv__io_start(uv_loop_t *loop,uv__io_t *w,uint events)

{
  void **ppvVar1;
  uint uVar2;
  long *plVar3;
  uv__io_t **ppuVar4;
  uint uVar5;
  uint uVar6;
  uv__io_t *puVar7;
  uv__io_t *local_38;
  
  if ((events & 0xffffdff8) != 0) {
    __assert_fail("0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI))",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x35b,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (events == 0) {
    __assert_fail("0 != events",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x35c,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  uVar5 = w->fd;
  if ((int)uVar5 < 0) {
    __assert_fail("w->fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x35d,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (uVar5 != 0x7fffffff) {
    uVar6 = events | w->pevents;
    w->pevents = uVar6;
    uVar2 = loop->nwatchers;
    if (uVar2 <= uVar5) {
      ppuVar4 = loop->watchers;
      if (ppuVar4 == (uv__io_t **)0x0) {
        local_38 = (uv__io_t *)0x0;
        puVar7 = (uv__io_t *)0x0;
      }
      else {
        puVar7 = ppuVar4[uVar2];
        local_38 = ppuVar4[(ulong)uVar2 + 1];
      }
      uVar5 = uVar5 + 2 >> 1 | uVar5 + 2;
      uVar5 = uVar5 >> 2 | uVar5;
      uVar5 = uVar5 >> 4 | uVar5;
      uVar5 = uVar5 >> 8 | uVar5;
      uVar5 = uVar5 >> 0x10 | uVar5;
      ppuVar4 = (uv__io_t **)uv__realloc(ppuVar4,(ulong)(uVar5 + 1) << 3);
      if (ppuVar4 == (uv__io_t **)0x0) {
        abort();
      }
      uVar2 = uVar5 - 1;
      uVar6 = loop->nwatchers;
      if (uVar6 < uVar2) {
        memset(ppuVar4 + uVar6,0,(ulong)((uVar5 - uVar6) - 2) * 8 + 8);
      }
      ppuVar4[uVar2] = puVar7;
      ppuVar4[uVar5] = local_38;
      loop->watchers = ppuVar4;
      loop->nwatchers = uVar2;
      uVar6 = w->pevents;
    }
    if (w->events != uVar6) {
      ppvVar1 = w->watcher_queue;
      if (ppvVar1 == (void **)w->watcher_queue[0]) {
        w->watcher_queue[0] = loop->watcher_queue;
        plVar3 = (long *)loop->watcher_queue[1];
        w->watcher_queue[1] = plVar3;
        *plVar3 = (long)ppvVar1;
        loop->watcher_queue[1] = ppvVar1;
      }
      if (loop->watchers[w->fd] == (uv__io_t *)0x0) {
        loop->watchers[w->fd] = w;
        loop->nfds = loop->nfds + 1;
      }
    }
    return;
  }
  __assert_fail("w->fd < INT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                ,0x35e,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
}

Assistant:

void uv__io_start(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  assert(0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI)));
  assert(0 != events);
  assert(w->fd >= 0);
  assert(w->fd < INT_MAX);

  w->pevents |= events;
  maybe_resize(loop, w->fd + 1);

#if !defined(__sun)
  /* The event ports backend needs to rearm all file descriptors on each and
   * every tick of the event loop but the other backends allow us to
   * short-circuit here if the event mask is unchanged.
   */
  if (w->events == w->pevents)
    return;
#endif

  if (QUEUE_EMPTY(&w->watcher_queue))
    QUEUE_INSERT_TAIL(&loop->watcher_queue, &w->watcher_queue);

  if (loop->watchers[w->fd] == NULL) {
    loop->watchers[w->fd] = w;
    loop->nfds++;
  }
}